

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

Info * __thiscall CMU462::Edge::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Edge *this)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m4);
  std::operator<<((ostream *)&m1,"EDGE");
  poVar2 = std::operator<<((ostream *)&m2,"Address: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m3,"Halfedge: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m4,"Boundary: ");
  p_Var1 = (this->_halfedge)._M_node;
  if ((*(char *)&p_Var1[3]._M_prev[0xc]._M_next == '\0') &&
     (*(char *)&p_Var1[1]._M_prev[3]._M_prev[0xc]._M_next != '\x01')) {
    pcVar3 = "NO";
  }
  else {
    pcVar3 = "YES";
  }
  std::operator<<(poVar2,pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,4);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m4);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m1);
  return __return_storage_ptr__;
}

Assistant:

Info Edge::getInfo() {
  Info info;

  ostringstream m1, m2, m3, m4;
  m1 << "EDGE";
  m2 << "Address: " << this;
  m3 << "Halfedge: " << elementAddress(halfedge());
  m4 << "Boundary: " << (isBoundary() ? "YES" : "NO");

  info.reserve(4);
  info.push_back(m1.str());
  info.push_back(string());
  info.push_back(m2.str());
  info.push_back(m3.str());
  info.push_back(string());
  info.push_back(m4.str());

  return info;
}